

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishChar(HelicsPublication pub,char val,HelicsError *err)

{
  PublicationObject *pPVar1;
  undefined8 in_RDX;
  char val_00;
  undefined1 in_SIL;
  PublicationObject *pubObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsPublication in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff0;
  
  val_00 = (char)((ulong)in_RDX >> 0x38);
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::publish((Publication *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),val_00);
  }
  return;
}

Assistant:

void helicsPublicationPublishChar(HelicsPublication pub, char val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}